

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_divu_16_d(void)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (ushort)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  if (uVar1 == 0) {
    m68ki_exception_trap(5);
    return;
  }
  uVar4 = m68ki_cpu.ir >> 9 & 7;
  uVar2 = (ulong)m68ki_cpu.dar[uVar4] / (ulong)uVar1;
  uVar3 = (uint)uVar2;
  if (uVar3 < 0x10000) {
    m68ki_cpu.n_flag = (uint)(uVar2 >> 8);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_cpu.not_z_flag = uVar3;
    m68ki_cpu.dar[uVar4] = m68ki_cpu.dar[uVar4] % (uint)uVar1 << 0x10 | uVar3;
    return;
  }
  m68ki_cpu.v_flag = 0x80;
  return;
}

Assistant:

static void m68k_op_divu_16_d(void)
{
	uint* r_dst = &DX;
	uint src = MASK_OUT_ABOVE_16(DY);

	if(src != 0)
	{
		uint quotient = *r_dst / src;
		uint remainder = *r_dst % src;

		if(quotient < 0x10000)
		{
			FLAG_Z = quotient;
			FLAG_N = NFLAG_16(quotient);
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = MASK_OUT_ABOVE_32(MASK_OUT_ABOVE_16(quotient) | (remainder << 16));
			return;
		}
		FLAG_V = VFLAG_SET;
		return;
	}
	m68ki_exception_trap(EXCEPTION_ZERO_DIVIDE);
}